

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedTimeZone::findPrev
          (RuleBasedTimeZone *this,UDate base,UBool inclusive,UDate *transitionTime,
          TimeZoneRule **fromRule,TimeZoneRule **toRule)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  UBool UVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  int32_t iVar9;
  double *pdVar10;
  TimeZoneRule *this_00;
  uint uVar11;
  TimeZoneRule *this_01;
  undefined7 in_register_00000031;
  TimeZoneRule *unaff_R13;
  bool bVar12;
  double base_00;
  UDate start0;
  UDate start1;
  double local_40;
  double local_38;
  
  if (this->fHistoricTransitions == (UVector *)0x0) {
    return '\0';
  }
  this_01 = (TimeZoneRule *)(CONCAT71(in_register_00000031,inclusive) & 0xffffffff);
  pdVar10 = (double *)UVector::elementAt(this->fHistoricTransitions,0);
  base_00 = *pdVar10;
  cVar2 = (char)this_01;
  if (((cVar2 != '\0') && (base_00 == base)) && (!NAN(base_00) && !NAN(base))) {
    this_01 = (TimeZoneRule *)pdVar10[1];
    unaff_R13 = (TimeZoneRule *)pdVar10[2];
    bVar12 = true;
    goto LAB_001ffc09;
  }
  if (base <= base_00) {
    bVar12 = false;
    goto LAB_001ffc09;
  }
  iVar7 = this->fHistoricTransitions->count;
  pdVar10 = (double *)UVector::elementAt(this->fHistoricTransitions,iVar7 + -1);
  base_00 = *pdVar10;
  if (((cVar2 == '\0') || (base_00 != base)) || (NAN(base_00) || NAN(base))) {
    if (base <= base_00) {
      if (1 < iVar7) {
        iVar7 = iVar7 + -2;
        do {
          pdVar10 = (double *)UVector::elementAt(this->fHistoricTransitions,iVar7);
          if ((iVar7 < 1) || (*pdVar10 < base)) break;
          iVar7 = iVar7 + -1;
        } while (cVar2 == '\0' || base != *pdVar10);
      }
      base_00 = *pdVar10;
      this_01 = (TimeZoneRule *)pdVar10[1];
      unaff_R13 = (TimeZoneRule *)pdVar10[2];
      bVar12 = true;
      bVar1 = true;
    }
    else {
      if (this->fFinalRules == (UVector *)0x0) goto LAB_001ffaa3;
      unaff_R13 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,0);
      this_00 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,1);
      uVar5 = TimeZoneRule::getRawOffset(this_00);
      uVar6 = TimeZoneRule::getDSTSavings(this_00);
      uVar11 = (uint)cVar2;
      iVar7 = (*(unaff_R13->super_UObject)._vptr_UObject[10])
                        (base,unaff_R13,(ulong)uVar5,(ulong)uVar6,(TimeZoneRule *)(ulong)uVar11,
                         &local_40);
      cVar2 = (char)iVar7;
      uVar5 = TimeZoneRule::getRawOffset(unaff_R13);
      uVar6 = TimeZoneRule::getDSTSavings(unaff_R13);
      iVar7 = (*(this_00->super_UObject)._vptr_UObject[10])
                        (base,this_00,(ulong)uVar5,(ulong)uVar6,(ulong)uVar11,&local_38);
      cVar3 = (char)iVar7;
      bVar1 = cVar2 != '\0' || cVar3 != '\0';
      this_01 = (TimeZoneRule *)(ulong)uVar11;
      if (((cVar2 != '\0' || cVar3 != '\0') &&
          (this_01 = this_00, base_00 = local_40, cVar3 != '\0')) && (local_40 <= local_38)) {
        this_01 = unaff_R13;
        unaff_R13 = this_00;
        base_00 = local_38;
      }
      bVar12 = cVar2 != '\0' || cVar3 != '\0';
    }
  }
  else {
LAB_001ffaa3:
    this_01 = (TimeZoneRule *)pdVar10[1];
    unaff_R13 = (TimeZoneRule *)pdVar10[2];
    bVar12 = true;
    bVar1 = true;
  }
  if (!bVar1) {
    return '\0';
  }
LAB_001ffc09:
  if (!bVar12) {
    return '\0';
  }
  iVar8 = TimeZoneRule::getRawOffset(this_01);
  iVar9 = TimeZoneRule::getRawOffset(unaff_R13);
  if (iVar8 == iVar9) {
    iVar8 = TimeZoneRule::getDSTSavings(this_01);
    iVar9 = TimeZoneRule::getDSTSavings(unaff_R13);
    if (iVar8 == iVar9) {
      UVar4 = findPrev(this,base_00,'\0',transitionTime,fromRule,toRule);
      return UVar4;
    }
  }
  *transitionTime = base_00;
  *fromRule = this_01;
  *toRule = unaff_R13;
  return '\x01';
}

Assistant:

UBool
RuleBasedTimeZone::findPrev(UDate base, UBool inclusive, UDate& transitionTime,
                            TimeZoneRule*& fromRule, TimeZoneRule*& toRule) const {
    if (fHistoricTransitions == NULL) {
        return FALSE;
    }
    UBool found = FALSE;
    Transition result;
    Transition *tzt = (Transition*)fHistoricTransitions->elementAt(0);
    UDate tt = tzt->time;
    if (inclusive && tt == base) {
        result = *tzt;
        found = TRUE;
    } else if (tt < base) {
        int32_t idx = fHistoricTransitions->size() - 1;        
        tzt = (Transition*)fHistoricTransitions->elementAt(idx);
        tt = tzt->time;
        if (inclusive && tt == base) {
            result = *tzt;
            found = TRUE;
        } else if (tt < base) {
            if (fFinalRules != NULL) {
                // Find a transion time with finalRules
                TimeZoneRule *r0 = (TimeZoneRule*)fFinalRules->elementAt(0);
                TimeZoneRule *r1 = (TimeZoneRule*)fFinalRules->elementAt(1);
                UDate start0, start1;
                UBool avail0 = r0->getPreviousStart(base, r1->getRawOffset(), r1->getDSTSavings(), inclusive, start0);
                UBool avail1 = r1->getPreviousStart(base, r0->getRawOffset(), r0->getDSTSavings(), inclusive, start1);
                //  avail0/avail1 should be always TRUE
                if (!avail0 && !avail1) {
                    return FALSE;
                }
                if (!avail1 || start0 > start1) {
                    result.time = start0;
                    result.from = r1;
                    result.to = r0;
                } else {
                    result.time = start1;
                    result.from = r0;
                    result.to = r1;
                }
            } else {
                result = *tzt;
            }
            found = TRUE;
        } else {
            // Find a transition within the historic transitions
            idx--;
            while (idx >= 0) {
                tzt = (Transition*)fHistoricTransitions->elementAt(idx);
                tt = tzt->time;
                if (tt < base || (inclusive && tt == base)) {
                    break;
                }
                idx--;
            }
            result = *tzt;
            found = TRUE;
        }
    }
    if (found) {
        // For now, this implementation ignore transitions with only zone name changes.
        if (result.from->getRawOffset() == result.to->getRawOffset()
            && result.from->getDSTSavings() == result.to->getDSTSavings()) {
            // No offset changes.  Try next one if not final
            return findPrev(result.time, FALSE /* always exclusive */,
                transitionTime, fromRule, toRule);
        }
        transitionTime = result.time;
        fromRule = result.from;
        toRule = result.to;
        return TRUE;
    }
    return FALSE;
}